

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O1

void __thiscall
cbtIDebugDraw::drawSpherePatch
          (cbtIDebugDraw *this,cbtVector3 *center,cbtVector3 *up,cbtVector3 *axis,cbtScalar radius,
          cbtScalar minTh,cbtScalar maxTh,cbtScalar minPs,cbtScalar maxPs,cbtVector3 *color,
          cbtScalar stepDegrees,bool drawCenter)

{
  cbtScalar *pcVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  uint uVar11;
  undefined1 *puVar12;
  long lVar13;
  uint uVar14;
  undefined1 *puVar15;
  cbtVector3 *pcVar16;
  long lVar17;
  undefined1 *puVar18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 in_register_00001204 [60];
  undefined1 in_register_00001244 [60];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 in_XMM17 [16];
  cbtVector3 arcStart;
  cbtVector3 spole;
  cbtVector3 npole;
  cbtVector3 vB [74];
  cbtVector3 vA [74];
  cbtVector3 local_9a8;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [1184];
  undefined1 local_4d8 [1192];
  
  auVar31._4_60_ = in_register_00001204;
  auVar31._0_4_ = radius;
  fVar2 = up->m_floats[0];
  fVar24 = up->m_floats[1];
  auVar25 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar31._0_16_);
  fVar27 = up->m_floats[2];
  auVar26 = vaddss_avx512f(auVar25,ZEXT416((uint)center->m_floats[0]));
  auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)(fVar24 * radius + center->m_floats[1])),0x10);
  local_988 = vinsertps_avx(auVar26,ZEXT416((uint)(fVar27 * radius + center->m_floats[2])),0x28);
  auVar26 = vsubss_avx512f(ZEXT416((uint)center->m_floats[0]),auVar25);
  auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)(center->m_floats[1] - fVar24 * radius)),0x10);
  local_998 = vinsertps_avx(auVar26,ZEXT416((uint)(center->m_floats[2] - fVar27 * radius)),0x28);
  fVar28 = stepDegrees * 0.017453292;
  bVar3 = minTh <= -1.5707964;
  auVar31 = ZEXT464((uint)(fVar28 + -1.5707964));
  fVar22 = (float)((uint)bVar3 * (int)(fVar28 + -1.5707964) + (uint)!bVar3 * (int)minTh);
  bVar4 = 1.5707964 <= maxTh;
  fVar29 = 1.5707964 - fVar28;
  fVar23 = (float)((uint)bVar4 * (int)fVar29 + (uint)!bVar4 * (int)maxTh);
  bVar9 = fVar22 <= fVar23;
  if (bVar9) {
    auVar31 = ZEXT1664(CONCAT124(in_register_00001244._0_12_,fVar22));
    fVar29 = fVar23;
  }
  auVar26 = vfmsub213ss_fma(ZEXT416((uint)axis->m_floats[2]),ZEXT416((uint)fVar24),
                            ZEXT416((uint)(axis->m_floats[1] * fVar27)));
  auVar25 = vfmsub213ss_fma(ZEXT416((uint)axis->m_floats[0]),ZEXT416((uint)fVar27),
                            ZEXT416((uint)(fVar2 * axis->m_floats[2])));
  fVar29 = fVar29 - auVar31._0_4_;
  uVar14 = (uint)(fVar29 / fVar28);
  auVar8 = vfmsub213ss_fma(ZEXT416((uint)axis->m_floats[1]),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(axis->m_floats[0] * fVar24)));
  if ((int)uVar14 < 2) {
    uVar14 = 1;
  }
  auVar5 = vcvtsi2ss_avx512f(in_XMM17,uVar14);
  bVar10 = maxPs < minPs;
  fVar24 = (float)((uint)bVar10 * (int)(fVar28 + -3.1415927) + (uint)!bVar10 * (int)minPs);
  fVar2 = (float)((uint)bVar10 * 0x40490fdb + (uint)!bVar10 * (int)maxPs) - fVar24;
  uVar11 = (uint)(fVar2 / fVar28);
  uVar19 = 1;
  if (1 < (int)uVar11) {
    uVar19 = uVar11;
  }
  auVar6 = vcvtsi2ss_avx512f(in_XMM17,uVar19);
  lVar13 = (ulong)uVar19 * 0x10;
  auVar30 = auVar31._0_16_;
  puVar15 = local_4d8;
  puVar18 = local_978;
  uVar19 = 0;
  do {
    puVar12 = puVar15;
    auVar7 = vcvtsi2ss_avx512f(in_XMM17,uVar19);
    auVar7 = vfmadd132ss_fma(auVar7,auVar31._0_16_,ZEXT416((uint)(fVar29 / auVar5._0_4_)));
    fVar27 = sinf(auVar7._0_4_);
    fVar27 = fVar27 * radius;
    fVar28 = cosf(auVar7._0_4_);
    iVar20 = 0;
    lVar17 = 0;
    do {
      auVar7 = vcvtsi2ss_avx512f(in_XMM17,iVar20);
      auVar7 = vfmadd213ss_fma(auVar7,ZEXT416((uint)(fVar2 / auVar6._0_4_)),ZEXT416((uint)fVar24));
      fVar23 = sinf(auVar7._0_4_);
      fVar22 = cosf(auVar7._0_4_);
      pcVar1 = (cbtScalar *)(puVar18 + lVar17);
      fVar22 = fVar28 * radius * fVar22;
      fVar23 = fVar28 * radius * fVar23;
      auVar7 = vinsertps_avx(ZEXT416((uint)(fVar23 * auVar26._0_4_ +
                                            fVar22 * axis->m_floats[0] + center->m_floats[0] +
                                           fVar27 * up->m_floats[0])),
                             ZEXT416((uint)(fVar23 * auVar25._0_4_ +
                                            fVar22 * axis->m_floats[1] + center->m_floats[1] +
                                           fVar27 * up->m_floats[1])),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar23 * auVar8._0_4_ +
                                                   fVar22 * axis->m_floats[2] + center->m_floats[2]
                                                  + fVar27 * up->m_floats[2])),0x28);
      *(undefined1 (*) [16])(puVar18 + lVar17) = auVar7;
      if (uVar19 == 0) {
        puVar15 = local_998;
        if (!bVar9 || bVar4) goto LAB_0080fd48;
      }
      else {
        puVar15 = puVar12 + lVar17;
LAB_0080fd48:
        (*this->_vptr_cbtIDebugDraw[4])(this,puVar15,pcVar1,color);
      }
      if (lVar17 == 0) {
        local_9a8.m_floats._0_8_ = *(undefined8 *)pcVar1;
        local_9a8.m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
      }
      else {
        (*this->_vptr_cbtIDebugDraw[4])(this,puVar18 + lVar17 + -0x10,pcVar1,color);
      }
      if ((!bVar9 || bVar3) && uVar19 == uVar14) {
        (*this->_vptr_cbtIDebugDraw[4])(this,local_988,pcVar1,color);
      }
      if (drawCenter) {
        if (maxPs - minPs < 6.2831855 && !bVar10) {
          pcVar16 = center;
          if ((lVar13 == lVar17 || lVar17 == 0) && (uVar19 == 0 || uVar19 == uVar14))
          goto LAB_0080fde1;
        }
        else {
          pcVar16 = &local_9a8;
          if (lVar13 == lVar17) {
LAB_0080fde1:
            (*this->_vptr_cbtIDebugDraw[4])(this,pcVar16,pcVar1,color);
          }
        }
      }
      lVar17 = lVar17 + 0x10;
      iVar20 = iVar20 + 1;
    } while (lVar13 + 0x10 != lVar17);
    bVar21 = uVar19 == uVar14;
    auVar31 = ZEXT1664(auVar30);
    puVar15 = puVar18;
    puVar18 = puVar12;
    uVar19 = uVar19 + 1;
    if (bVar21) {
      return;
    }
  } while( true );
}

Assistant:

virtual void drawSpherePatch(const cbtVector3& center, const cbtVector3& up, const cbtVector3& axis, cbtScalar radius,
								 cbtScalar minTh, cbtScalar maxTh, cbtScalar minPs, cbtScalar maxPs, const cbtVector3& color, cbtScalar stepDegrees = cbtScalar(10.f), bool drawCenter = true)
	{
		cbtVector3 vA[74];
		cbtVector3 vB[74];
		cbtVector3 *pvA = vA, *pvB = vB, *pT;
		cbtVector3 npole = center + up * radius;
		cbtVector3 spole = center - up * radius;
		cbtVector3 arcStart;
		cbtScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		const cbtVector3& kv = up;
		const cbtVector3& iv = axis;
		cbtVector3 jv = kv.cross(iv);
		bool drawN = false;
		bool drawS = false;
		if (minTh <= -SIMD_HALF_PI)
		{
			minTh = -SIMD_HALF_PI + step;
			drawN = true;
		}
		if (maxTh >= SIMD_HALF_PI)
		{
			maxTh = SIMD_HALF_PI - step;
			drawS = true;
		}
		if (minTh > maxTh)
		{
			minTh = -SIMD_HALF_PI + step;
			maxTh = SIMD_HALF_PI - step;
			drawN = drawS = true;
		}
		int n_hor = (int)((maxTh - minTh) / step) + 1;
		if (n_hor < 2) n_hor = 2;
		cbtScalar step_h = (maxTh - minTh) / cbtScalar(n_hor - 1);
		bool isClosed = false;
		if (minPs > maxPs)
		{
			minPs = -SIMD_PI + step;
			maxPs = SIMD_PI;
			isClosed = true;
		}
		else if ((maxPs - minPs) >= SIMD_PI * cbtScalar(2.f))
		{
			isClosed = true;
		}
		else
		{
			isClosed = false;
		}
		int n_vert = (int)((maxPs - minPs) / step) + 1;
		if (n_vert < 2) n_vert = 2;
		cbtScalar step_v = (maxPs - minPs) / cbtScalar(n_vert - 1);
		for (int i = 0; i < n_hor; i++)
		{
			cbtScalar th = minTh + cbtScalar(i) * step_h;
			cbtScalar sth = radius * cbtSin(th);
			cbtScalar cth = radius * cbtCos(th);
			for (int j = 0; j < n_vert; j++)
			{
				cbtScalar psi = minPs + cbtScalar(j) * step_v;
				cbtScalar sps = cbtSin(psi);
				cbtScalar cps = cbtCos(psi);
				pvB[j] = center + cth * cps * iv + cth * sps * jv + sth * kv;
				if (i)
				{
					drawLine(pvA[j], pvB[j], color);
				}
				else if (drawS)
				{
					drawLine(spole, pvB[j], color);
				}
				if (j)
				{
					drawLine(pvB[j - 1], pvB[j], color);
				}
				else
				{
					arcStart = pvB[j];
				}
				if ((i == (n_hor - 1)) && drawN)
				{
					drawLine(npole, pvB[j], color);
				}

				if (drawCenter)
				{
					if (isClosed)
					{
						if (j == (n_vert - 1))
						{
							drawLine(arcStart, pvB[j], color);
						}
					}
					else
					{
						if (((!i) || (i == (n_hor - 1))) && ((!j) || (j == (n_vert - 1))))
						{
							drawLine(center, pvB[j], color);
						}
					}
				}
			}
			pT = pvA;
			pvA = pvB;
			pvB = pT;
		}
	}